

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<LibrarySearchPath>::moveAppend
          (QGenericArrayOps<LibrarySearchPath> *this,LibrarySearchPath *b,LibrarySearchPath *e)

{
  qsizetype *pqVar1;
  LibrarySearchPath *pLVar2;
  long lVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  
  if ((b != e) && (b < e)) {
    pLVar2 = (this->super_QArrayDataPointer<LibrarySearchPath>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<LibrarySearchPath>).size;
      pDVar4 = (b->super_QMakeLocalFileName).real_name.d.d;
      (b->super_QMakeLocalFileName).real_name.d.d = (Data *)0x0;
      pLVar2[lVar3].super_QMakeLocalFileName.real_name.d.d = pDVar4;
      pcVar5 = (b->super_QMakeLocalFileName).real_name.d.ptr;
      (b->super_QMakeLocalFileName).real_name.d.ptr = (char16_t *)0x0;
      pLVar2[lVar3].super_QMakeLocalFileName.real_name.d.ptr = pcVar5;
      qVar6 = (b->super_QMakeLocalFileName).real_name.d.size;
      (b->super_QMakeLocalFileName).real_name.d.size = 0;
      pLVar2[lVar3].super_QMakeLocalFileName.real_name.d.size = qVar6;
      pDVar4 = (b->super_QMakeLocalFileName).local_name.d.d;
      (b->super_QMakeLocalFileName).local_name.d.d = (Data *)0x0;
      pLVar2[lVar3].super_QMakeLocalFileName.local_name.d.d = pDVar4;
      pcVar5 = (b->super_QMakeLocalFileName).local_name.d.ptr;
      (b->super_QMakeLocalFileName).local_name.d.ptr = (char16_t *)0x0;
      pLVar2[lVar3].super_QMakeLocalFileName.local_name.d.ptr = pcVar5;
      qVar6 = (b->super_QMakeLocalFileName).local_name.d.size;
      (b->super_QMakeLocalFileName).local_name.d.size = 0;
      pLVar2[lVar3].super_QMakeLocalFileName.local_name.d.size = qVar6;
      pLVar2[lVar3]._default = b->_default;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<LibrarySearchPath>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }